

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceListFieldsTest_OneOfTest_Test::
~NoFieldPresenceListFieldsTest_OneOfTest_Test(NoFieldPresenceListFieldsTest_OneOfTest_Test *this)

{
  pointer ppFVar1;
  
  (this->super_NoFieldPresenceListFieldsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceListFieldsTest_018b0d48;
  ppFVar1 = (this->super_NoFieldPresenceListFieldsTest).fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar1 != (pointer)0x0) {
    operator_delete(ppFVar1,(long)(this->super_NoFieldPresenceListFieldsTest).fields_.
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar1
                   );
  }
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceListFieldsTest).message_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x2e0);
  return;
}

Assistant:

TEST_F(NoFieldPresenceListFieldsTest, OneOfTest) {
  // Oneof fields behave essentially like an explicit presence field.
  message_.set_oneof_uint32(0);
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());

  fields_.clear();
  // Note:
  // we don't clear message_ -- oneof must only maintain one present field.
  message_.set_oneof_uint32(42);
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());
}